

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::CreateDataPropertyOrThrow
          (JavascriptArray *this,RecyclableObject *obj,BigIndex index,Var item,
          ScriptContext *scriptContext)

{
  uint uVar1;
  ThreadContext *threadContext;
  JavascriptArray *this_00;
  BigIndex idxDest;
  BigIndex index_00;
  JavascriptArray *arr;
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Var item_local;
  RecyclableObject *obj_local;
  BigIndex index_local;
  
  idxDest.bigIndex = (Var)index.bigIndex;
  index_local._0_8_ = index._0_8_;
  obj_local._0_4_ = (uint)obj;
  jsReentLock._24_8_ = item;
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)item);
  JsReentLock::JsReentLock((JsReentLock *)&arr,threadContext);
  this_00 = TryVarToNonES5Array(this);
  if (this_00 == (JavascriptArray *)0x0) {
    JsReentLock::unlock((JsReentLock *)&arr);
    idxDest.index = index_local.index;
    idxDest._4_4_ = index_local._4_4_;
    uVar1 = SetArrayLikeObjects(this,(RecyclableObject *)(ulong)(uint)obj_local,idxDest,item);
    index_00.bigIndex = (uint64)item;
    index_00.index = index_local.index;
    index_00._4_4_ = index_local._4_4_;
    ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar1,jsReentLock._24_4_,
                        (ScriptContext *)(ulong)(uint)obj_local,index_00);
    JsReentLock::MutateArrayObject((JsReentLock *)&arr);
    JsReentLock::relock((JsReentLock *)&arr);
  }
  else {
    GenericDirectSetItemAt(this_00,(BigIndex *)&obj_local,idxDest.bigIndex);
  }
  JsReentLock::~JsReentLock((JsReentLock *)&arr);
  return;
}

Assistant:

void JavascriptArray::CreateDataPropertyOrThrow(RecyclableObject * obj, BigIndex index, Var item, ScriptContext * scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(obj);
        if (arr != nullptr)
        {
            arr->GenericDirectSetItemAt(index, item);
        }
        else
        {
            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(obj, index, item), scriptContext, index));
        }
    }